

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::ShouldShard
               (char *total_shards_env,char *shard_index_env,bool in_subprocess_for_death_test)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  ostream *poVar4;
  long in_FS_OFFSET;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,in_subprocess_for_death_test) == 0) {
    uVar2 = Int32FromEnvOrDie(total_shards_env,-1);
    uVar3 = Int32FromEnvOrDie(shard_index_env,-1);
    if ((uVar3 & uVar2) != 0xffffffff) {
      if (uVar3 != 0xffffffff && uVar2 == 0xffffffff) {
        Message::Message((Message *)&local_40);
        poVar4 = (ostream *)(local_40._M_dataplus._M_p + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"Invalid environment variables: you have ",0x28);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"GTEST_SHARD_INDEX",0x11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        std::ostream::operator<<((ostream *)poVar4,uVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", but have left ",0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"GTEST_TOTAL_SHARDS",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," unset.\n",8);
        Message::Message((Message *)&local_48,(Message *)&local_40);
        if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
        }
        StringStreamToString(&local_40,local_48.ptr_);
LAB_0014bd41:
        ColoredPrintf(COLOR_RED,local_40._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_40);
        fflush(_stdout);
        exit(1);
      }
      if (uVar2 != 0xffffffff && uVar3 == 0xffffffff) {
        Message::Message((Message *)&local_40);
        poVar4 = (ostream *)(local_40._M_dataplus._M_p + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"Invalid environment variables: you have ",0x28);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"GTEST_TOTAL_SHARDS",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        std::ostream::operator<<((ostream *)poVar4,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", but have left ",0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"GTEST_SHARD_INDEX",0x11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," unset.\n",8);
        Message::Message((Message *)&local_48,(Message *)&local_40);
        if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
        }
        StringStreamToString(&local_40,local_48.ptr_);
        goto LAB_0014bd41;
      }
      if (((int)uVar3 < 0) || ((int)uVar2 <= (int)uVar3)) {
        Message::Message((Message *)&local_40);
        poVar4 = (ostream *)(local_40._M_dataplus._M_p + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"Invalid environment variables: we require 0 <= ",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"GTEST_SHARD_INDEX",0x11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," < ",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"GTEST_TOTAL_SHARDS",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", but you have ",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"GTEST_SHARD_INDEX",0x11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"=",1);
        std::ostream::operator<<((ostream *)poVar4,uVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"GTEST_TOTAL_SHARDS",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"=",1);
        std::ostream::operator<<((ostream *)poVar4,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,".\n",2);
        Message::Message((Message *)&local_48,(Message *)&local_40);
        if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
        }
        StringStreamToString(&local_40,local_48.ptr_);
        goto LAB_0014bd41;
      }
      bVar1 = 1 < (int)uVar2;
      goto LAB_0014bb9d;
    }
  }
  bVar1 = false;
LAB_0014bb9d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ShouldShard(const char* total_shards_env,
                 const char* shard_index_env,
                 bool in_subprocess_for_death_test) {
  if (in_subprocess_for_death_test) {
    return false;
  }

  const Int32 total_shards = Int32FromEnvOrDie(total_shards_env, -1);
  const Int32 shard_index = Int32FromEnvOrDie(shard_index_env, -1);

  if (total_shards == -1 && shard_index == -1) {
    return false;
  } else if (total_shards == -1 && shard_index != -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestShardIndex << " = " << shard_index
      << ", but have left " << kTestTotalShards << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (total_shards != -1 && shard_index == -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestTotalShards << " = " << total_shards
      << ", but have left " << kTestShardIndex << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (shard_index < 0 || shard_index >= total_shards) {
    const Message msg = Message()
      << "Invalid environment variables: we require 0 <= "
      << kTestShardIndex << " < " << kTestTotalShards
      << ", but you have " << kTestShardIndex << "=" << shard_index
      << ", " << kTestTotalShards << "=" << total_shards << ".\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  }

  return total_shards > 1;
}